

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall ArgTest_VisitInvalidArg_Test::TestBody(ArgTest_VisitInvalidArg_Test *this)

{
  mock_visitor<fmt::v5::monostate> *this_00;
  MockSpec<test_result_(fmt::v5::monostate)> *this_01;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<fmt::v5::monostate>_> visitor;
  undefined1 local_f8 [16];
  linked_ptr_internal local_e8 [2];
  StrictMock<mock_visitor<fmt::v5::monostate>_> local_d8;
  
  testing::StrictMock<mock_visitor<fmt::v5::monostate>_>::StrictMock(&local_d8);
  local_f8._8_8_ = operator_new(8);
  (((MatcherInterface<fmt::v5::monostate> *)local_f8._8_8_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_001d8c10;
  local_e8[0].next_ = local_e8;
  local_f8._0_8_ = &PTR__MatcherBase_001d8ab8;
  this_00 = &local_d8.super_mock_visitor<fmt::v5::monostate>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,this_00);
  this_01 = testing::internal::FunctionMocker<test_result_(fmt::v5::monostate)>::With
                      (&this_00->gmock1_visit_268,(Matcher<fmt::v5::monostate> *)local_f8);
  testing::internal::MockSpec<test_result_(fmt::v5::monostate)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x196,"visitor","visit(_)");
  local_f8._0_8_ = &PTR__MatcherBase_001d41d8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_> *)(local_f8 + 8));
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
  local_e8[0].next_ = local_e8[0].next_ & 0xffffffff00000000;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<fmt::v5::monostate>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d8,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)local_f8);
  testing::StrictMock<mock_visitor<fmt::v5::monostate>_>::~StrictMock(&local_d8);
  return;
}

Assistant:

TEST(ArgTest, VisitInvalidArg) {
  testing::StrictMock< mock_visitor<fmt::monostate> > visitor;
  EXPECT_CALL(visitor, visit(_));
  fmt::basic_format_arg<fmt::format_context> arg;
  visit(visitor, arg);
}